

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brent.c
# Opt level: O2

double brent_zero(custom_funcuni *funcuni,double ai,double bi,double tol,double eps)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double local_18;
  
  dVar1 = (*funcuni->funcuni)(ai,funcuni->params);
  dVar2 = (*funcuni->funcuni)(bi,funcuni->params);
  dVar11 = dVar1;
  dVar13 = ai;
  dVar8 = bi;
  if (ABS(dVar1) < ABS(dVar2)) {
    dVar11 = dVar2;
    dVar2 = dVar1;
    dVar13 = bi;
    dVar8 = ai;
  }
  local_18 = bi - ai;
  dVar6 = dVar13 - dVar8;
  dVar1 = dVar8;
  dVar14 = dVar11;
  dVar4 = local_18;
  dVar3 = dVar13;
  while( true ) {
    dVar5 = ABS(dVar1) * (eps + eps) + tol;
    dVar6 = dVar6 * 0.5;
    dVar7 = ABS(dVar6);
    if ((dVar7 < dVar5) || ((dVar2 == 0.0 && (!NAN(dVar2))))) break;
    dVar15 = dVar6;
    dVar10 = dVar6;
    if ((dVar5 <= ABS(dVar4)) && (ABS(dVar2) < ABS(dVar11))) {
      dVar8 = dVar2 / dVar11;
      dVar9 = dVar6 + dVar6;
      if ((dVar3 != dVar13) || (NAN(dVar3) || NAN(dVar13))) {
        dVar11 = dVar11 / dVar14;
        dVar12 = dVar2 / dVar14 + -1.0;
        dVar9 = (dVar11 - dVar2 / dVar14) * dVar9 * dVar11 - (dVar1 - dVar3) * dVar12;
        dVar11 = (dVar8 + -1.0) * (dVar11 + -1.0) * dVar12;
      }
      else {
        dVar11 = 1.0 - dVar8;
      }
      dVar8 = dVar8 * dVar9;
      dVar9 = -dVar8;
      dVar3 = dVar8;
      if (dVar8 <= dVar9) {
        dVar3 = dVar9;
      }
      dVar11 = (double)(~-(ulong)(dVar9 < dVar8) & (ulong)dVar11 |
                       (ulong)-dVar11 & -(ulong)(dVar9 < dVar8));
      if ((dVar3 + dVar3 < dVar6 * 3.0 * dVar11 - ABS(dVar5 * dVar11)) &&
         (dVar3 < ABS(dVar4 * 0.5 * dVar11))) {
        dVar7 = ABS(dVar3 / dVar11);
        dVar15 = local_18;
        dVar10 = dVar3 / dVar11;
      }
    }
    if (dVar7 <= dVar5) {
      if (dVar6 <= 0.0) {
        dVar8 = dVar1 - dVar5;
      }
      else {
        dVar8 = dVar5 + dVar1;
      }
    }
    else {
      dVar8 = dVar1 + dVar10;
    }
    dVar4 = (*funcuni->funcuni)(dVar8,funcuni->params);
    if (((0.0 < dVar4) && (0.0 < dVar14)) || ((local_18 = dVar10, dVar4 <= 0.0 && (dVar14 <= 0.0))))
    {
      dVar15 = dVar8 - dVar1;
      dVar13 = dVar1;
      dVar14 = dVar2;
      local_18 = dVar15;
    }
    dVar5 = dVar8;
    dVar7 = dVar4;
    dVar11 = dVar2;
    dVar3 = dVar1;
    if (ABS(dVar14) < ABS(dVar4)) {
      dVar5 = dVar13;
      dVar7 = dVar14;
      dVar11 = dVar4;
      dVar13 = dVar8;
      dVar14 = dVar4;
      dVar3 = dVar8;
    }
    dVar6 = dVar13 - dVar5;
    dVar2 = dVar7;
    dVar1 = dVar5;
    dVar4 = dVar15;
  }
  return dVar8;
}

Assistant:

double brent_zero(custom_funcuni *funcuni, double ai, double bi, double tol, double eps) {
	double bz;
	double a,b,c,d,e,fa,fb,fc;
	double m,s,etol,fd,p,q,r;
	int iter;
	
	fd = eps;
	
	a = ai;
	b = bi;
	c = a;
	fa = FUNCUNI_EVAL(funcuni,a);
	fb = FUNCUNI_EVAL(funcuni,b);
	fc = fa;
	e = b - a;
	d = e;
	
	if (fabs(fc) < fabs(fb)) {
		a = b;
		b = c;
		c = a;
		fa = fb;
		fb = fc;
		fc = fa;
	}
		
	etol = 2 * fd * fabs(b) + tol;
	m = 0.5 * (c - b);
	
	bz = b;
	iter = 0;
	while (fabs ( m ) >= etol && fb != 0.0) {

		iter++;
		
		if (fabs(e) < etol || fabs(fa) <= fabs(fb)) {
			e = m;
			d = e;
		} else {
			
			s = fb/fa;
			if (a == c) {
				// linear interpolation
				p = 2.0 * m * s;
				q = 1.0 - s;
			} else {
				// inverse quadratic interpolation
				q = fa/fc;
				r = fb/fc;
				p = s * (2 * m * q * (q - r) - (b - a) * (r - 1.0));
				q = (q - 1.0) * (r - 1.0) * (s - 1.0);
			}
			
			if (p > 0.0) {
				q = - q;
			} else {
				p = - p;
			}

			s = e;
			e = d;
			
			if ( 2.0 * p < 3.0 * m * q - fabs( etol * q ) && p < fabs( 0.5 * s * q ) ) {
				d = p /q;
			} else {
				e = m;
				d = e;
			}
			
		}
		a = b;
		fa = fb;
		
		if ( fabs(d) > etol ) {
			b += d;
		} else if ( 0.0 < m ) {
			b += etol;
		} else {
			b -= etol;
		}
		
		fb = FUNCUNI_EVAL(funcuni,b);
		
		bz = b;
		if ( ( 0.0 < fb && 0.0 < fc ) || ( fb <= 0.0 && fc <= 0.0 ) ) {
			c = a;
			fc = fa;
			e = b - a;
			d = e;
		}
      
		// To the end of the loop
		
		if (fabs(fc) < fabs(fb)) {
			a = b;
			b = c;
			c = a;
			fa = fb;
			fb = fc;
			fc = fa;
		}
		
		etol = 2 * fd * fabs(b) + tol;
		m = 0.5 * (c - b);
		
	}
	
	return bz;
}